

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O2

void __thiscall jrtplib::RTPSourceData::~RTPSourceData(RTPSourceData *this)

{
  RTPMemoryManager *mgr;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPSourceData_00145cb0;
  FlushPackets(this);
  if ((jrtplib *)this->byereason != (jrtplib *)0x0) {
    RTPDeleteByteArray((jrtplib *)this->byereason,(uint8_t *)(this->super_RTPMemoryObject).mgr,mgr);
  }
  if (this->rtpaddr != (RTPAddress *)0x0) {
    RTPDelete<jrtplib::RTPAddress>(this->rtpaddr,(this->super_RTPMemoryObject).mgr);
  }
  if (this->rtcpaddr != (RTPAddress *)0x0) {
    RTPDelete<jrtplib::RTPAddress>(this->rtcpaddr,(this->super_RTPMemoryObject).mgr);
  }
  RTCPSDESInfo::~RTCPSDESInfo(&this->SDESinf);
  std::__cxx11::_List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::_M_clear
            (&(this->packetlist).
              super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>);
  return;
}

Assistant:

RTPSourceData::~RTPSourceData()
{
	FlushPackets();
	if (byereason)
		RTPDeleteByteArray(byereason,GetMemoryManager());
	if (rtpaddr)
		RTPDelete(rtpaddr,GetMemoryManager());
	if (rtcpaddr)
		RTPDelete(rtcpaddr,GetMemoryManager());
}